

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::getSymmetricKey(SoftHSM *this,SymmetricKey *skey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString keybits;
  ByteString local_78;
  ByteString local_50;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || skey == (SymmetricKey *)0x0;
  if (key == (OSObject *)0x0 || (bool)uVar2) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&local_50);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_78,key,0x11);
    ByteString::operator=(&local_50,&local_78);
    local_78._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_78.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_78,key,0x11);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_78,(uchar *)&local_50,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    local_78._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_78.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_0013056f;
  }
  (*(skey->super_Serialisable)._vptr_Serialisable[3])(skey,&local_50);
  CVar4 = 0;
LAB_0013056f:
  local_50._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_50.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getSymmetricKey(SymmetricKey* skey, Token* token, OSObject* key)
{
	if (skey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	ByteString keybits;
	if (isKeyPrivate)
	{
		if (!token->decrypt(key->getByteStringValue(CKA_VALUE), keybits))
			return CKR_GENERAL_ERROR;
	}
	else
	{
		keybits = key->getByteStringValue(CKA_VALUE);
	}

	skey->setKeyBits(keybits);

	return CKR_OK;
}